

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_sqlite.cpp
# Opt level: O2

void handle_sqlite_callback
               (void *qobj,int aoperation,char *adbname,char *atablename,sqlite3_int64 arowid)

{
  long in_FS_OFFSET;
  QByteArrayView QVar1;
  QMetaMethodArgument local_80;
  QByteArrayView local_68;
  QArrayDataPointer<char16_t> local_58;
  QMetaMethodArgument local_40;
  sqlite3_int64 arowid_local;
  char *atablename_local;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  arowid_local = arowid;
  atablename_local = atablename;
  if (qobj != (void *)0x0) {
    QByteArrayView::QByteArrayView<const_char_*,_true>(&local_68,&atablename_local);
    QVar1.m_data = (storage_type_conflict *)local_68.m_size;
    QVar1.m_size = (qsizetype)&local_58;
    QString::fromUtf8(QVar1);
    local_40.metaType =
         (QMetaTypeInterface *)&QtPrivate::QMetaTypeInterfaceWrapper<QString>::metaType;
    local_40.name = "QString";
    local_80.metaType =
         (QMetaTypeInterface *)&QtPrivate::QMetaTypeInterfaceWrapper<long_long>::metaType;
    local_80.name = "qint64";
    local_80.data = &arowid_local;
    local_40.data = &local_58;
    QMetaObject::invokeMethod<QMetaMethodArgument,QMetaMethodArgument>
              ((QObject *)qobj,"handleNotification",QueuedConnection,&local_40,&local_80);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void handle_sqlite_callback(void *qobj,int aoperation, char const *adbname, char const *atablename,
                                   sqlite3_int64 arowid)
{
    Q_UNUSED(aoperation);
    Q_UNUSED(adbname);
    QSQLiteDriver *driver = static_cast<QSQLiteDriver *>(qobj);
    if (driver) {
        QMetaObject::invokeMethod(driver, "handleNotification", Qt::QueuedConnection,
                                  Q_ARG(QString, QString::fromUtf8(atablename)), Q_ARG(qint64, arowid));
    }
}